

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,NamedPoint *val)

{
  double *val_00;
  double t;
  value_t vVar1;
  json_value jVar2;
  char *pcVar3;
  string *val_01;
  reference pvVar4;
  string_view val_02;
  json json;
  complex<double> cval;
  data local_48;
  data local_38;
  data local_28;
  
  if (type == HELICS_NAMED_POINT) goto switchD_001f2502_caseD_6;
  t = val->value;
  if (NAN(t)) {
    val_02._M_str = (val->name)._M_dataplus._M_p;
    val_02._M_len = (val->name)._M_string_length;
    typeConvert(__return_storage_ptr__,type,val_02);
    return __return_storage_ptr__;
  }
  val_00 = &val->value;
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    helicsNamedPointString_abi_cxx11_((string *)&cval,(helics *)val,val);
    json.m_data._0_8_ = cval._M_value._8_8_;
    json.m_data.m_value = (json_value)cval._M_value._0_8_;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&json);
    std::__cxx11::string::~string((string *)&cval);
    break;
  case HELICS_DOUBLE:
    ValueConverter<double>::convert(__return_storage_ptr__,val_00);
    break;
  case HELICS_INT:
    cval._M_value._0_8_ = (BADTYPE)t;
    goto LAB_001f265d;
  case HELICS_COMPLEX:
    cval._M_value._8_8_ = 0;
    cval._M_value._0_8_ = t;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,&cval);
    break;
  case HELICS_VECTOR:
    ValueConverter<double>::convert(__return_storage_ptr__,val_00,1);
    break;
  case HELICS_COMPLEX_VECTOR:
    cval._M_value._8_8_ = 0;
    cval._M_value._0_8_ = t;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,&cval,1);
    break;
  case HELICS_NAMED_POINT:
    goto switchD_001f2502_caseD_6;
  case HELICS_BOOL:
    pcVar3 = "+0";
    if (t != 0.0) {
      pcVar3 = "*1";
    }
    if (NAN(t)) {
      pcVar3 = "*1";
    }
    cval._M_value._8_8_ = pcVar3 + 1;
    cval._M_value._0_8_ = 1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&cval);
    break;
  case HELICS_TIME:
    cval._M_value._0_8_ = count_time<9,_long>::convert(t);
LAB_001f265d:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&cval);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_01 = typeNameStringRef_abi_cxx11_(HELICS_NAMED_POINT);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_01);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_28.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_28.m_value;
      local_28.m_type = vVar1;
      local_28.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_28);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"name");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_38.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_38.m_value;
      local_38.m_type = vVar1;
      local_38.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_38);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<const_double_&,_double,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_48,val_00);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_48.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_48.m_value;
      local_48.m_type = vVar1;
      local_48.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      fileops::generateJsonString((string *)&cval,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cval);
      std::__cxx11::string::~string((string *)&cval);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
    goto switchD_001f2502_caseD_6;
  }
  return __return_storage_ptr__;
switchD_001f2502_caseD_6:
  ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,val);
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, const NamedPoint& val)
{
    if (type == DataType::HELICS_NAMED_POINT) {
        return ValueConverter<NamedPoint>::convert(val);
    }
    if (std::isnan(val.value)) {
        // just convert the string
        return typeConvert(type, val.name);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(val.value);
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(val.value));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(val.value).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(
                std::complex<double>(val.value, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val.value != 0) ? "1" : "0");
        case DataType::HELICS_NAMED_POINT:
        default:
            return ValueConverter<NamedPoint>::convert(val);
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(
                (std::isnan(val.value)) ? val.name : helicsNamedPointString(val));
        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cval(val.value, 0.0);
            return ValueConverter<std::complex<double>>::convert(&cval, 1);
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<double>::convert(&(val.value), 1);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_NAMED_POINT);
            json["name"] = val.name;
            json["value"] = val.value;
            return fileops::generateJsonString(json);
        }
    }
}